

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

void SpawnShootDecal(AActor *t1,FTraceResults *trace)

{
  AWeapon *pAVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar3;
  
  if ((t1->player != (player_t *)0x0) &&
     (pAVar1 = t1->player->ReadyWeapon, pAVar1 != (AWeapon *)0x0)) {
    pPVar3 = (pAVar1->super_AInventory).super_AActor.super_DThinker.super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(pAVar1->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject)
                        (pAVar1);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (pAVar1->super_AInventory).super_AActor.super_DThinker.super_DObject.Class = pPVar3;
    }
    t1 = (AActor *)pPVar3->Defaults;
  }
  if (t1->DecalGenerator != (FDecalBase *)0x0) {
    iVar2 = (**t1->DecalGenerator->_vptr_FDecalBase)();
    DImpactDecal::StaticCreate
              ((FDecalTemplate *)CONCAT44(extraout_var_00,iVar2),&trace->HitPos,
               trace->Line->sidedef[trace->Side],trace->ffloor,(PalEntry)0x0);
    return;
  }
  return;
}

Assistant:

void SpawnShootDecal(AActor *t1, const FTraceResults &trace)
{
	FDecalBase *decalbase = NULL;

	if (t1->player != NULL && t1->player->ReadyWeapon != NULL)
	{
		decalbase = t1->player->ReadyWeapon->GetDefault()->DecalGenerator;
	}
	else
	{
		decalbase = t1->DecalGenerator;
	}
	if (decalbase != NULL)
	{
		DImpactDecal::StaticCreate(decalbase->GetDecal(),
			trace.HitPos, trace.Line->sidedef[trace.Side], trace.ffloor);
	}
}